

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O2

string * squall::detail::TypeMaskList<Foo*>::doit_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  TypeMaskList<>::doit_abi_cxx11_();
  std::operator+(in_RDI,'.',&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

static string doit() {
        return typemask<H>() + TypeMaskList<T...>::doit();
    }